

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O0

void __thiscall QFormLayout::insertRow(QFormLayout *this,int row,QString *labelText,QLayout *field)

{
  bool bVar1;
  long in_RCX;
  QWidget *in_RDX;
  QFlagsStorage<Qt::WindowType> in_ESI;
  QLayoutPrivate *in_RDI;
  long in_FS_OFFSET;
  QFormLayoutPrivate *d;
  QWidget *in_stack_ffffffffffffffa8;
  QLabel *in_stack_ffffffffffffffb0;
  QWidget *label;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined1 local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QFormLayout *)0x4b6008);
  if ((in_RCX == 0) ||
     (bVar1 = QLayoutPrivate::checkLayout
                        (in_RDI,(QLayout *)
                                CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),
     bVar1)) {
    bVar1 = QString::isEmpty((QString *)0x4b603f);
    if (bVar1) {
      label = (QWidget *)0x0;
    }
    else {
      in_stack_ffffffffffffffa8 = (QWidget *)operator_new(0x28);
      memset(local_c,0,4);
      QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x4b6082);
      QLabel::QLabel(in_stack_ffffffffffffffb0,(QString *)in_stack_ffffffffffffffa8,in_RDX,
                     (WindowFlags)in_ESI.i);
      label = in_stack_ffffffffffffffa8;
    }
    insertRow((QFormLayout *)in_RDI,in_ESI.i,label,(QLayout *)in_stack_ffffffffffffffa8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFormLayout::insertRow(int row, const QString &labelText, QLayout *field)
{
    Q_D(QFormLayout);
    if (field && !d->checkLayout(field))
        return;

    insertRow(row, labelText.isEmpty() ? nullptr : new QLabel(labelText), field);
}